

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O3

QFontEngine * __thiscall QFontEngineMulti::loadEngine(QFontEngineMulti *this,int at)

{
  QString *pQVar1;
  ulong uVar2;
  QFontEngine *pQVar3;
  long lVar4;
  undefined8 *puVar5;
  QFontDef *pQVar6;
  long in_FS_OFFSET;
  QString local_e0;
  QArrayDataPointer<QString> local_c8;
  QFontDef local_a8;
  QArrayDataPointer<QString> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar5 = &DAT_006a82a8;
  pQVar6 = &local_a8;
  for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pQVar6->families).d.d = (Data *)*puVar5;
    puVar5 = puVar5 + 1;
    pQVar6 = (QFontDef *)&(pQVar6->families).d.ptr;
  }
  local_a8.families.d.d = (this->super_QFontEngine).fontDef.families.d.d;
  local_a8.families.d.ptr = (this->super_QFontEngine).fontDef.families.d.ptr;
  local_a8.families.d.size = (this->super_QFontEngine).fontDef.families.d.size;
  if (local_a8.families.d.d != (Data *)0x0) {
    LOCK();
    ((local_a8.families.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.families.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
    ;
    UNLOCK();
  }
  local_a8.styleName.d.d = (this->super_QFontEngine).fontDef.styleName.d.d;
  local_a8.styleName.d.ptr = (this->super_QFontEngine).fontDef.styleName.d.ptr;
  local_a8.styleName.d.size = (this->super_QFontEngine).fontDef.styleName.d.size;
  if (&(local_a8.styleName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_a8.styleName.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_a8.styleName.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.fallBackFamilies.d.d = (this->super_QFontEngine).fontDef.fallBackFamilies.d.d;
  local_a8.fallBackFamilies.d.ptr = (this->super_QFontEngine).fontDef.fallBackFamilies.d.ptr;
  local_a8.fallBackFamilies.d.size = (this->super_QFontEngine).fontDef.fallBackFamilies.d.size;
  if (local_a8.fallBackFamilies.d.d != (Data *)0x0) {
    LOCK();
    ((local_a8.fallBackFamilies.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_a8.fallBackFamilies.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_a8.variableAxisValues.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
        )(this->super_QFontEngine).fontDef.variableAxisValues.d.d.ptr;
  if (local_a8.variableAxisValues.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_a8.variableAxisValues.d.d.ptr = *(int *)local_a8.variableAxisValues.d.d.ptr + 1;
    UNLOCK();
  }
  local_a8.pointSize = (this->super_QFontEngine).fontDef.pointSize;
  local_a8.pixelSize = (this->super_QFontEngine).fontDef.pixelSize;
  local_a8._96_8_ = *(ulong *)&(this->super_QFontEngine).fontDef.field_0x60 | 0x8000;
  pQVar1 = (this->m_fallbackFamilies).d.ptr;
  lVar4 = (long)at;
  local_e0.d.d = pQVar1[lVar4 + -1].d.d;
  local_e0.d.ptr = pQVar1[lVar4 + -1].d.ptr;
  local_e0.d.size = pQVar1[lVar4 + -1].d.size;
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_e0.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_e0.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (QString *)0x0;
  local_c8.size = 0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_c8,0,&local_e0);
  QList<QString>::end((QList<QString> *)&local_c8);
  local_38.size = local_a8.families.d.size;
  local_38.ptr = local_a8.families.d.ptr;
  local_38.d = local_a8.families.d.d;
  local_a8.families.d.size = local_c8.size;
  local_a8.families.d.ptr = local_c8.ptr;
  local_a8.families.d.d = local_c8.d;
  local_c8.size = 0;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (QString *)0x0;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_38);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar3 = QFontDatabasePrivate::findFont(&local_a8,2,false);
  if (pQVar3 != (QFontEngine *)0x0) {
    uVar2 = *(ulong *)&(pQVar3->fontDef).field_0x60;
    *(ulong *)&(pQVar3->fontDef).field_0x60 =
         uVar2 & 0xfffc00ffffffffff | local_a8._96_8_ & 0x3ff0000000000;
    if ((local_a8._96_8_ & 0x30000000) != 0) {
      *(ulong *)&(pQVar3->fontDef).field_0x60 =
           uVar2 & 0xfffc00ffcfffffff | local_a8._96_8_ & 0x3ff0000000000 |
           local_a8._96_8_ & 0x30000000;
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_a8.variableAxisValues.d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8.fallBackFamilies.d);
  if (&(local_a8.styleName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a8.styleName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_a8.styleName.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QFontEngine *QFontEngineMulti::loadEngine(int at)
{
    QFontDef request(fontDef);
    request.styleStrategy |= QFont::NoFontMerging;
    request.families = QStringList(fallbackFamilyAt(at - 1));

    // At this point, the main script of the text has already been considered
    // when fetching the list of fallback families from the database, and the
    // info about the actual script of the characters may have been discarded,
    // so we do not check for writing system support, but instead just load
    // the family indiscriminately.
    if (QFontEngine *engine = QFontDatabasePrivate::findFont(request, QFontDatabasePrivate::Script_Common)) {
        engine->fontDef.weight = request.weight;
        if (request.style > QFont::StyleNormal)
            engine->fontDef.style = request.style;
        return engine;
    }

    return nullptr;
}